

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O2

void oggpack_adv(oggpack_buffer *b,int bits)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = b->storage;
  if (lVar1 - (b->endbit + bits + 7 >> 3) < b->endbyte) {
    b->ptr = (uchar *)0x0;
    uVar2 = 1;
  }
  else {
    uVar2 = b->endbit + bits;
    lVar1 = (long)((int)uVar2 / 8);
    b->ptr = b->ptr + lVar1;
    lVar1 = b->endbyte + lVar1;
    uVar2 = uVar2 & 7;
  }
  b->endbyte = lVar1;
  b->endbit = uVar2;
  return;
}

Assistant:

void oggpack_adv(oggpack_buffer *b,int bits){
  bits+=b->endbit;

  if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;

  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return;

 overflow:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
}